

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void evsig_handler(int sig)

{
  int iVar1;
  int *piVar2;
  undefined1 local_11;
  int r;
  uint uStack_c;
  uint8_t msg;
  int save_errno;
  int sig_local;
  
  uStack_c = sig;
  piVar2 = __errno_location();
  r = *piVar2;
  if (evsig_base == (event_base *)0x0) {
    event_warnx("%s: received signal %d, but have no base configured","evsig_handler",
                (ulong)uStack_c);
  }
  else {
    local_11 = (undefined1)uStack_c;
    write(evsig_base_fd,&local_11,1);
    iVar1 = r;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

static void __cdecl
evsig_handler(int sig)
{
	int save_errno = errno;
#ifdef _WIN32
	int socket_errno = EVUTIL_SOCKET_ERROR();
#endif
	ev_uint8_t msg;

	if (evsig_base == NULL) {
		event_warnx(
			"%s: received signal %d, but have no base configured",
			__func__, sig);
		return;
	}

#ifndef EVENT__HAVE_SIGACTION
	signal(sig, evsig_handler);
#endif

	/* Wake up our notification mechanism */
	msg = sig;
#ifdef _WIN32
	send(evsig_base_fd, (char*)&msg, 1, 0);
#else
	{
		int r = write(evsig_base_fd, (char*)&msg, 1);
		(void)r; /* Suppress 'unused return value' and 'unused var' */
	}
#endif
	errno = save_errno;
#ifdef _WIN32
	EVUTIL_SET_SOCKET_ERROR(socket_errno);
#endif
}